

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultLogger.cpp
# Opt level: O2

void Assimp::DefaultLogger::set(Logger *logger)

{
  if ((undefined8 *)m_pLogger != &s_pNullLogger && m_pLogger != (undefined *)0x0) {
    (**(code **)(*(long *)m_pLogger + 8))();
  }
  if (logger == (Logger *)0x0) {
    logger = (Logger *)&s_pNullLogger;
  }
  m_pLogger = (undefined *)logger;
  return;
}

Assistant:

void DefaultLogger::set( Logger *logger ) {
    // enter the mutex here to avoid concurrency problems
#ifndef ASSIMP_BUILD_SINGLETHREADED
    std::lock_guard<std::mutex> lock(loggerMutex);
#endif

    if ( nullptr == logger ) {
        logger = &s_pNullLogger;
    }
    if ( nullptr != m_pLogger && !isNullLogger() ) {
        delete m_pLogger;
    }

    DefaultLogger::m_pLogger = logger;
}